

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O0

void __thiscall arangodb::velocypack::Builder::reportAdd(Builder *this)

{
  size_type sVar1;
  value_type_conflict1 *__x;
  long in_RDI;
  size_type in_stack_00000008;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000010;
  vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
  *this_00;
  
  sVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::capacity
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x90));
  if (sVar1 == 0) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
              (in_stack_00000010,in_stack_00000008);
  }
  __x = (value_type_conflict1 *)(in_RDI + 0x90);
  this_00 = *(vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
              **)(in_RDI + 0x20);
  std::
  vector<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
  ::back(this_00);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00,__x);
  return;
}

Assistant:

void Builder::reportAdd() {
  VELOCYPACK_ASSERT(!_stack.empty());
  if (_indexes.capacity() == 0) {
    // make an initial reservation for several items at
    // a time, in order to save frequent reallocations for
    // the first few attributes
    _indexes.reserve(8);
  }
  _indexes.push_back(_pos - _stack.back().startPos);
}